

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_port.c
# Opt level: O2

int csp_socket_close(csp_socket_t *sock)

{
  int iVar1;
  long lVar2;
  csp_queue_handle_t handle;
  csp_packet_t *packet;
  
  if (sock != (csp_socket_t *)0x0) {
    for (lVar2 = 8; lVar2 != 0x128; lVar2 = lVar2 + 0x10) {
      if ((*(int *)(lVar2 + 0x1176c8) == 1) &&
         (*(csp_socket_t **)((long)&ports[0].state + lVar2) == sock)) {
        *(undefined4 *)(lVar2 + 0x1176c8) = 0;
        *(undefined8 *)((long)&ports[0].state + lVar2) = 0;
        break;
      }
    }
    handle = sock->rx_queue;
    if (handle != (csp_queue_handle_t)0x0) {
      packet = (csp_packet_t *)0x0;
      while (iVar1 = csp_queue_dequeue(handle,&packet,0), iVar1 == 0) {
        if (packet != (csp_packet_t *)0x0) {
          csp_buffer_free(packet);
        }
        handle = sock->rx_queue;
      }
      csp_queue_free(sock->rx_queue);
    }
  }
  return 0;
}

Assistant:

int csp_socket_close(csp_socket_t * sock) {
	if (sock == NULL) {
		return CSP_ERR_NONE;
	}

	for (size_t i = 0; i < CSP_PORT_MAX_BIND + 2; i++) {
		csp_port_t * port = &ports[i];

		if (port->state == PORT_OPEN && port->socket == sock) {
			port->state = PORT_CLOSED;
			port->socket = NULL;
			break;
		}
	}

	if (sock->rx_queue != NULL) {
		csp_packet_t * packet = NULL;

		while (csp_queue_dequeue(sock->rx_queue, &packet, 0) == CSP_QUEUE_OK) {
			if (packet != NULL) {
				csp_buffer_free(packet);
			}
		}
		csp_queue_free(sock->rx_queue);
	}

	return CSP_ERR_NONE;
}